

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictbe.cpp
# Opt level: O0

int32_t __thiscall
icu_63::CjkBreakEngine::divideUpDictionaryRange
          (CjkBreakEngine *this,UText *inText,int32_t rangeStart,int32_t rangeEnd,
          UVector32 *foundBreaks)

{
  DictionaryMatcher *pDVar1;
  UBool UVar2;
  UBool UVar3;
  bool bVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int32_t iVar8;
  uint32_t uVar9;
  UChar32 UVar10;
  int32_t iVar11;
  int32_t iVar12;
  int64_t iVar13;
  UnicodeString *this_00;
  UVector32 *pUVar14;
  UVector32 *this_01;
  int32_t *piVar15;
  int32_t *piVar16;
  size_t sVar17;
  LocalPointer<icu_63::UVector32> *size;
  bool bVar18;
  int local_580;
  bool local_535;
  UVector32 *local_478;
  int32_t local_454;
  uint local_420;
  UnicodeString *local_3e0;
  UVector32 *local_388;
  int32_t utextPos;
  int32_t cpPos;
  int32_t i_4;
  int32_t prevUTextPos;
  int32_t prevCPPos;
  int32_t i_3;
  int32_t numBreaks;
  UVector32 t_boundary;
  int32_t local_310;
  uint32_t newSnlp_1;
  int32_t j_1;
  int32_t katakanaRunLength;
  bool is_katakana;
  int32_t ln_j_i;
  uint32_t newSnlp;
  int32_t j;
  int32_t count;
  int32_t i_2;
  undefined1 auStack_2e8 [3];
  bool is_prev_katakana;
  int32_t ix;
  UText fu;
  undefined1 local_250 [8];
  UVector32 lengths;
  UVector32 values;
  int32_t maxWordSize;
  int32_t i_1;
  UVector32 prev;
  undefined1 local_1e0 [4];
  int32_t i;
  UVector32 bestSnlp;
  int local_1b8;
  int32_t cuIdx;
  int32_t cpIdx;
  UBool hadExistingMap;
  int32_t numCodePts;
  int32_t nativeEnd;
  int32_t fragmentOriginalStart;
  UChar32 c_1;
  int32_t fragmentStartI;
  int32_t srcI;
  UnicodeString normalizedFragment;
  UnicodeString fragment;
  LocalPointerBase<icu_63::UVector32> local_f8;
  LocalPointer<icu_63::UVector32> normalizedMap;
  UnicodeString normalizedInput;
  UChar32 c;
  int32_t nativePosition;
  int local_94;
  int32_t limit;
  UErrorCode local_88 [2];
  UErrorCode status;
  LocalPointerBase<icu_63::UVector32> local_78;
  LocalPointer<icu_63::UVector32> inputMap;
  UnicodeString inString;
  UVector32 *foundBreaks_local;
  int32_t rangeEnd_local;
  int32_t rangeStart_local;
  UText *inText_local;
  CjkBreakEngine *this_local;
  
  if (rangeEnd <= rangeStart) {
    return 0;
  }
  UnicodeString::UnicodeString((UnicodeString *)&inputMap);
  LocalPointer<icu_63::UVector32>::LocalPointer
            ((LocalPointer<icu_63::UVector32> *)&local_78,(UVector32 *)0x0);
  local_88[0] = U_ZERO_ERROR;
  uVar7 = inText->providerProperties;
  uVar5 = utext_i32_flag(2);
  if (((((uVar7 & uVar5) == 0) || ((long)rangeStart < inText->chunkNativeStart)) ||
      (inText->chunkNativeLimit < (long)rangeEnd)) ||
     ((long)inText->nativeIndexingLimit < (long)rangeEnd - inText->chunkNativeStart)) {
    sVar17 = (size_t)rangeStart;
    utext_setNativeIndex_63(inText,sVar17);
    iVar13 = utext_nativeLength_63(inText);
    local_94 = rangeEnd;
    if (iVar13 < rangeEnd) {
      iVar13 = utext_nativeLength_63(inText);
      local_94 = (int)iVar13;
    }
    pUVar14 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar17);
    local_388 = (UVector32 *)0x0;
    if (pUVar14 != (UVector32 *)0x0) {
      UVector32::UVector32(pUVar14,local_88);
      local_388 = pUVar14;
    }
    LocalPointer<icu_63::UVector32>::adoptInsteadAndCheckErrorCode
              ((LocalPointer<icu_63::UVector32> *)&local_78,local_388,local_88);
    UVar2 = ::U_FAILURE(local_88[0]);
    if (UVar2 != '\0') {
      this_local._4_4_ = 0;
      goto LAB_003d0e07;
    }
    while (iVar13 = utext_getNativeIndex_63(inText), iVar13 < local_94) {
      iVar13 = utext_getNativeIndex_63(inText);
      UVar10 = utext_next32_63(inText);
      UnicodeString::append((UnicodeString *)&inputMap,UVar10);
      while( true ) {
        pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        iVar8 = UVector32::size(pUVar14);
        iVar11 = UnicodeString::length((UnicodeString *)&inputMap);
        if (iVar11 <= iVar8) break;
        pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        UVector32::addElement(pUVar14,(int32_t)iVar13,local_88);
      }
    }
    pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
    UVector32::addElement(pUVar14,local_94,local_88);
  }
  else {
    ConstChar16Ptr::ConstChar16Ptr
              ((ConstChar16Ptr *)&stack0xffffffffffffff70,
               inText->chunkContents + ((long)rangeStart - inText->chunkNativeStart));
    UnicodeString::setTo
              ((UnicodeString *)&inputMap,'\0',(ConstChar16Ptr *)&stack0xffffffffffffff70,
               rangeEnd - rangeStart);
    ConstChar16Ptr::~ConstChar16Ptr((ConstChar16Ptr *)&stack0xffffffffffffff70);
  }
  size = &inputMap;
  iVar6 = (*(this->nfkcNorm2->super_UObject)._vptr_UObject[0xb])(this->nfkcNorm2,size,local_88);
  if ((char)iVar6 == '\0') {
    UnicodeString::UnicodeString((UnicodeString *)&normalizedMap);
    this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x20,(size_t)size);
    local_3e0 = (UnicodeString *)0x0;
    if (this_00 != (UnicodeString *)0x0) {
      UVector32::UVector32((UVector32 *)this_00,local_88);
      local_3e0 = this_00;
    }
    LocalPointer<icu_63::UVector32>::LocalPointer
              ((LocalPointer<icu_63::UVector32> *)&local_f8,(UVector32 *)local_3e0,local_88);
    UVar2 = ::U_FAILURE(local_88[0]);
    if (UVar2 == '\0') {
      UnicodeString::UnicodeString((UnicodeString *)((long)&normalizedFragment.fUnion + 0x30));
      UnicodeString::UnicodeString((UnicodeString *)&fragmentStartI);
      c_1 = 0;
LAB_003cfd72:
      UVar10 = c_1;
      iVar8 = UnicodeString::length((UnicodeString *)&inputMap);
      if (c_1 < iVar8) {
        UnicodeString::remove
                  ((UnicodeString *)((long)&normalizedFragment.fUnion + 0x30),(char *)local_3e0);
        nativeEnd = UnicodeString::char32At((UnicodeString *)&inputMap,c_1);
        do {
          UnicodeString::append
                    ((UnicodeString *)((long)&normalizedFragment.fUnion + 0x30),nativeEnd);
          c_1 = UnicodeString::moveIndex32((UnicodeString *)&inputMap,c_1,1);
          iVar8 = UnicodeString::length((UnicodeString *)&inputMap);
          if (c_1 == iVar8) break;
          nativeEnd = UnicodeString::char32At((UnicodeString *)&inputMap,c_1);
          iVar6 = (*(this->nfkcNorm2->super_UObject)._vptr_UObject[0xf])
                            (this->nfkcNorm2,(ulong)(uint)nativeEnd);
        } while ((char)iVar6 == '\0');
        (*(this->nfkcNorm2->super_UObject)._vptr_UObject[3])
                  (this->nfkcNorm2,(undefined1 *)((long)&normalizedFragment.fUnion + 0x30),
                   &fragmentStartI,local_88);
        local_3e0 = (UnicodeString *)&fragmentStartI;
        UnicodeString::append((UnicodeString *)&normalizedMap,local_3e0);
        UVar2 = LocalPointerBase<icu_63::UVector32>::isValid(&local_78);
        if (UVar2 == '\0') {
          local_420 = UVar10 + rangeStart;
        }
        else {
          pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
          local_3e0 = (UnicodeString *)(ulong)(uint)UVar10;
          local_420 = UVector32::elementAti(pUVar14,UVar10);
        }
        do {
          pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_f8);
          iVar8 = UVector32::size(pUVar14);
          iVar11 = UnicodeString::length((UnicodeString *)&normalizedMap);
          if (iVar11 <= iVar8) break;
          pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_f8);
          local_3e0 = (UnicodeString *)(ulong)local_420;
          UVector32::addElement(pUVar14,local_420,local_88);
          UVar2 = ::U_FAILURE(local_88[0]);
        } while (UVar2 == '\0');
        goto LAB_003cfd72;
      }
      UVar2 = LocalPointerBase<icu_63::UVector32>::isValid(&local_78);
      if (UVar2 == '\0') {
        local_454 = UnicodeString::length((UnicodeString *)&inputMap);
        local_454 = local_454 + rangeStart;
      }
      else {
        pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        iVar8 = UnicodeString::length((UnicodeString *)&inputMap);
        local_454 = UVector32::elementAti(pUVar14,iVar8);
      }
      pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_f8);
      UVector32::addElement(pUVar14,local_454,local_88);
      LocalPointer<icu_63::UVector32>::moveFrom
                ((LocalPointer<icu_63::UVector32> *)&local_78,
                 (LocalPointer<icu_63::UVector32> *)&local_f8);
      UnicodeString::moveFrom((UnicodeString *)&inputMap,(UnicodeString *)&normalizedMap);
      UnicodeString::~UnicodeString((UnicodeString *)&fragmentStartI);
      UnicodeString::~UnicodeString((UnicodeString *)((long)&normalizedFragment.fUnion + 0x30));
      bVar4 = false;
    }
    else {
      this_local._4_4_ = 0;
      bVar4 = true;
    }
    LocalPointer<icu_63::UVector32>::~LocalPointer((LocalPointer<icu_63::UVector32> *)&local_f8);
    UnicodeString::~UnicodeString((UnicodeString *)&normalizedMap);
    if (bVar4) goto LAB_003d0e07;
  }
  sVar17 = 0;
  prevUTextPos = UnicodeString::countChar32((UnicodeString *)&inputMap,0,0x7fffffff);
  uVar7 = UnicodeString::length((UnicodeString *)&inputMap);
  if (prevUTextPos != uVar7) {
    UVar2 = LocalPointerBase<icu_63::UVector32>::isValid(&local_78);
    if (UVar2 == '\0') {
      pUVar14 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,sVar17);
      local_478 = (UVector32 *)0x0;
      if (pUVar14 != (UVector32 *)0x0) {
        UVector32::UVector32(pUVar14,local_88);
        local_478 = pUVar14;
      }
      LocalPointer<icu_63::UVector32>::adoptInsteadAndCheckErrorCode
                ((LocalPointer<icu_63::UVector32> *)&local_78,local_478,local_88);
      UVar3 = ::U_FAILURE(local_88[0]);
      if (UVar3 != '\0') {
        this_local._4_4_ = 0;
        goto LAB_003d0e07;
      }
    }
    local_1b8 = 0;
    bestSnlp.elements._4_4_ = 0;
    while( true ) {
      if (UVar2 == '\0') {
        pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        UVector32::addElement(pUVar14,bestSnlp.elements._4_4_ + rangeStart,local_88);
      }
      else {
        pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        this_01 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
        iVar8 = UVector32::elementAti(this_01,bestSnlp.elements._4_4_);
        UVector32::setElementAt(pUVar14,iVar8,local_1b8);
      }
      iVar6 = bestSnlp.elements._4_4_;
      local_1b8 = local_1b8 + 1;
      iVar8 = UnicodeString::length((UnicodeString *)&inputMap);
      if (iVar6 == iVar8) break;
      bestSnlp.elements._4_4_ =
           UnicodeString::moveIndex32((UnicodeString *)&inputMap,bestSnlp.elements._4_4_,1);
    }
  }
  UVector32::UVector32((UVector32 *)local_1e0,prevUTextPos + 1,local_88);
  UVector32::addElement((UVector32 *)local_1e0,0,local_88);
  for (prev.elements._4_4_ = 1; prev.elements._4_4_ <= prevUTextPos;
      prev.elements._4_4_ = prev.elements._4_4_ + 1) {
    UVector32::addElement((UVector32 *)local_1e0,-1,local_88);
  }
  UVector32::UVector32((UVector32 *)&maxWordSize,prevUTextPos + 1,local_88);
  for (values.elements._4_4_ = 0; values.elements._4_4_ <= prevUTextPos;
      values.elements._4_4_ = values.elements._4_4_ + 1) {
    UVector32::addElement((UVector32 *)&maxWordSize,-1,local_88);
  }
  UVector32::UVector32((UVector32 *)&lengths.elements,prevUTextPos,local_88);
  UVector32::setSize((UVector32 *)&lengths.elements,prevUTextPos);
  UVector32::UVector32((UVector32 *)local_250,prevUTextPos,local_88);
  UVector32::setSize((UVector32 *)local_250,prevUTextPos);
  fu.b = 0;
  fu.c = 0;
  fu.privA = 0;
  fu.privP = (void *)0x0;
  fu.a = 0;
  fu.q = (void *)0x0;
  fu.r = (void *)0x0;
  fu.context = (void *)0x0;
  fu.p = (void *)0x0;
  fu.pFuncs = (UTextFuncs *)0x0;
  fu.pExtra = (void *)0x0;
  fu.chunkOffset = 0;
  fu.chunkLength = 0;
  fu.chunkContents = (UChar *)0x0;
  fu.extraSize = 0;
  fu.nativeIndexingLimit = 0;
  fu.chunkNativeStart = 0;
  fu.providerProperties = 0;
  fu.sizeOfStruct = 0;
  fu.chunkNativeLimit = 0;
  _auStack_2e8 = 0x345ad82c;
  ix = 0;
  fu.magic = 0;
  fu.flags = 0x90;
  utext_openUnicodeString_63((UText *)auStack_2e8,(UnicodeString *)&inputMap,local_88);
  i_2 = 0;
  count._3_1_ = false;
  j = 0;
  while (j < prevUTextPos) {
    iVar8 = UVector32::elementAti((UVector32 *)local_1e0,j);
    if (iVar8 != -1) {
      utext_setNativeIndex_63((UText *)auStack_2e8,(long)i_2);
      pDVar1 = this->fDictionary;
      piVar15 = UVector32::getBuffer((UVector32 *)local_250);
      piVar16 = UVector32::getBuffer((UVector32 *)&lengths.elements);
      uVar9 = (*pDVar1->_vptr_DictionaryMatcher[2])
                        (pDVar1,auStack_2e8,0x14,(ulong)(uint)prevUTextPos,0,piVar15,piVar16,0);
      newSnlp = uVar9;
      if ((uVar9 == 0) || (iVar8 = UVector32::elementAti((UVector32 *)local_250,0), iVar8 != 1)) {
        UVar10 = UnicodeString::char32At((UnicodeString *)&inputMap,i_2);
        UVar2 = UnicodeSet::contains(&this->fHangulWordSet,UVar10);
        if (UVar2 == '\0') {
          UVector32::setElementAt((UVector32 *)&lengths.elements,0xff,uVar9);
          newSnlp = uVar9 + 1;
          UVector32::setElementAt((UVector32 *)local_250,1,uVar9);
        }
      }
      for (ln_j_i = 0; ln_j_i < (int)newSnlp; ln_j_i = ln_j_i + 1) {
        iVar8 = UVector32::elementAti((UVector32 *)local_1e0,j);
        iVar11 = UVector32::elementAti((UVector32 *)&lengths.elements,ln_j_i);
        iVar12 = UVector32::elementAti((UVector32 *)local_250,ln_j_i);
        iVar6 = iVar12 + j;
        uVar7 = UVector32::elementAti((UVector32 *)local_1e0,iVar6);
        if ((uint)(iVar8 + iVar11) < uVar7) {
          UVector32::setElementAt((UVector32 *)local_1e0,iVar8 + iVar11,iVar6);
          UVector32::setElementAt((UVector32 *)&maxWordSize,j,iVar6);
        }
      }
      UVar10 = UnicodeString::char32At((UnicodeString *)&inputMap,i_2);
      bVar4 = isKatakana(UVar10);
      newSnlp_1 = 1;
      bVar18 = count._3_1_ == false;
      count._3_1_ = bVar4;
      if ((bVar18) && (bVar4)) {
        local_310 = UnicodeString::moveIndex32((UnicodeString *)&inputMap,i_2,1);
        while( true ) {
          iVar8 = UnicodeString::length((UnicodeString *)&inputMap);
          local_535 = false;
          if ((local_310 < iVar8) && (local_535 = false, (int)newSnlp_1 < 0x14)) {
            UVar10 = UnicodeString::char32At((UnicodeString *)&inputMap,local_310);
            local_535 = isKatakana(UVar10);
          }
          if (local_535 == false) break;
          local_310 = UnicodeString::moveIndex32((UnicodeString *)&inputMap,local_310,1);
          newSnlp_1 = newSnlp_1 + 1;
        }
        if ((int)newSnlp_1 < 0x14) {
          iVar8 = UVector32::elementAti((UVector32 *)local_1e0,j);
          uVar9 = getKatakanaCost(newSnlp_1);
          t_boundary.elements._4_4_ = iVar8 + uVar9;
          uVar7 = UVector32::elementAti((UVector32 *)local_1e0,j + newSnlp_1);
          if (iVar8 + uVar9 < uVar7) {
            UVector32::setElementAt((UVector32 *)local_1e0,t_boundary.elements._4_4_,j + newSnlp_1);
            UVector32::setElementAt((UVector32 *)&maxWordSize,j,j + newSnlp_1);
          }
        }
      }
    }
    j = j + 1;
    i_2 = UnicodeString::moveIndex32((UnicodeString *)&inputMap,i_2,1);
  }
  utext_close_63((UText *)auStack_2e8);
  UVector32::UVector32((UVector32 *)&i_3,prevUTextPos + 1,local_88);
  prevCPPos = 0;
  iVar8 = UVector32::elementAti((UVector32 *)local_1e0,prevUTextPos);
  if (iVar8 == -1) {
    UVector32::addElement((UVector32 *)&i_3,prevUTextPos,local_88);
    prevCPPos = 1;
  }
  else {
    for (; 0 < prevUTextPos;
        prevUTextPos = UVector32::elementAti((UVector32 *)&maxWordSize,prevUTextPos)) {
      UVector32::addElement((UVector32 *)&i_3,prevUTextPos,local_88);
      prevCPPos = prevCPPos + 1;
    }
  }
  iVar8 = UVector32::size(foundBreaks);
  if ((iVar8 == 0) || (iVar8 = UVector32::peeki(foundBreaks), iVar8 < rangeStart)) {
    UVector32::addElement((UVector32 *)&i_3,0,local_88);
    prevCPPos = prevCPPos + 1;
  }
  cpPos = -1;
  utextPos = prevCPPos;
  while (utextPos = utextPos + -1, -1 < utextPos) {
    local_580 = UVector32::elementAti((UVector32 *)&i_3,utextPos);
    UVar2 = LocalPointerBase<icu_63::UVector32>::isValid(&local_78);
    if (UVar2 == '\0') {
      local_580 = local_580 + rangeStart;
    }
    else {
      pUVar14 = LocalPointerBase<icu_63::UVector32>::operator->(&local_78);
      local_580 = UVector32::elementAti(pUVar14,local_580);
    }
    if (cpPos < local_580) {
      UVector32::push(foundBreaks,local_580,local_88);
    }
    else {
      prevCPPos = prevCPPos + -1;
    }
    cpPos = local_580;
  }
  this_local._4_4_ = prevCPPos;
  UVector32::~UVector32((UVector32 *)&i_3);
  UVector32::~UVector32((UVector32 *)local_250);
  UVector32::~UVector32((UVector32 *)&lengths.elements);
  UVector32::~UVector32((UVector32 *)&maxWordSize);
  UVector32::~UVector32((UVector32 *)local_1e0);
LAB_003d0e07:
  LocalPointer<icu_63::UVector32>::~LocalPointer((LocalPointer<icu_63::UVector32> *)&local_78);
  UnicodeString::~UnicodeString((UnicodeString *)&inputMap);
  return this_local._4_4_;
}

Assistant:

int32_t 
CjkBreakEngine::divideUpDictionaryRange( UText *inText,
        int32_t rangeStart,
        int32_t rangeEnd,
        UVector32 &foundBreaks ) const {
    if (rangeStart >= rangeEnd) {
        return 0;
    }

    // UnicodeString version of input UText, NFKC normalized if necessary.
    UnicodeString inString;

    // inputMap[inStringIndex] = corresponding native index from UText inText.
    // If NULL then mapping is 1:1
    LocalPointer<UVector32>     inputMap;

    UErrorCode     status      = U_ZERO_ERROR;


    // if UText has the input string as one contiguous UTF-16 chunk
    if ((inText->providerProperties & utext_i32_flag(UTEXT_PROVIDER_STABLE_CHUNKS)) &&
         inText->chunkNativeStart <= rangeStart &&
         inText->chunkNativeLimit >= rangeEnd   &&
         inText->nativeIndexingLimit >= rangeEnd - inText->chunkNativeStart) {

        // Input UText is in one contiguous UTF-16 chunk.
        // Use Read-only aliasing UnicodeString.
        inString.setTo(FALSE,
                       inText->chunkContents + rangeStart - inText->chunkNativeStart,
                       rangeEnd - rangeStart);
    } else {
        // Copy the text from the original inText (UText) to inString (UnicodeString).
        // Create a map from UnicodeString indices -> UText offsets.
        utext_setNativeIndex(inText, rangeStart);
        int32_t limit = rangeEnd;
        U_ASSERT(limit <= utext_nativeLength(inText));
        if (limit > utext_nativeLength(inText)) {
            limit = (int32_t)utext_nativeLength(inText);
        }
        inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        while (utext_getNativeIndex(inText) < limit) {
            int32_t nativePosition = (int32_t)utext_getNativeIndex(inText);
            UChar32 c = utext_next32(inText);
            U_ASSERT(c != U_SENTINEL);
            inString.append(c);
            while (inputMap->size() < inString.length()) {
                inputMap->addElement(nativePosition, status);
            }
        }
        inputMap->addElement(limit, status);
    }


    if (!nfkcNorm2->isNormalized(inString, status)) {
        UnicodeString normalizedInput;
        //  normalizedMap[normalizedInput position] ==  original UText position.
        LocalPointer<UVector32> normalizedMap(new UVector32(status), status);
        if (U_FAILURE(status)) {
            return 0;
        }
        
        UnicodeString fragment;
        UnicodeString normalizedFragment;
        for (int32_t srcI = 0; srcI < inString.length();) {  // Once per normalization chunk
            fragment.remove();
            int32_t fragmentStartI = srcI;
            UChar32 c = inString.char32At(srcI);
            for (;;) {
                fragment.append(c);
                srcI = inString.moveIndex32(srcI, 1);
                if (srcI == inString.length()) {
                    break;
                }
                c = inString.char32At(srcI);
                if (nfkcNorm2->hasBoundaryBefore(c)) {
                    break;
                }
            }
            nfkcNorm2->normalize(fragment, normalizedFragment, status);
            normalizedInput.append(normalizedFragment);

            // Map every position in the normalized chunk to the start of the chunk
            //   in the original input.
            int32_t fragmentOriginalStart = inputMap.isValid() ?
                    inputMap->elementAti(fragmentStartI) : fragmentStartI+rangeStart;
            while (normalizedMap->size() < normalizedInput.length()) {
                normalizedMap->addElement(fragmentOriginalStart, status);
                if (U_FAILURE(status)) {
                    break;
                }
            }
        }
        U_ASSERT(normalizedMap->size() == normalizedInput.length());
        int32_t nativeEnd = inputMap.isValid() ?
                inputMap->elementAti(inString.length()) : inString.length()+rangeStart;
        normalizedMap->addElement(nativeEnd, status);

        inputMap.moveFrom(normalizedMap);
        inString.moveFrom(normalizedInput);
    }

    int32_t numCodePts = inString.countChar32();
    if (numCodePts != inString.length()) {
        // There are supplementary characters in the input.
        // The dictionary will produce boundary positions in terms of code point indexes,
        //   not in terms of code unit string indexes.
        // Use the inputMap mechanism to take care of this in addition to indexing differences
        //    from normalization and/or UTF-8 input.
        UBool hadExistingMap = inputMap.isValid();
        if (!hadExistingMap) {
            inputMap.adoptInsteadAndCheckErrorCode(new UVector32(status), status);
            if (U_FAILURE(status)) {
                return 0;
            }
        }
        int32_t cpIdx = 0;
        for (int32_t cuIdx = 0; ; cuIdx = inString.moveIndex32(cuIdx, 1)) {
            U_ASSERT(cuIdx >= cpIdx);
            if (hadExistingMap) {
                inputMap->setElementAt(inputMap->elementAti(cuIdx), cpIdx);
            } else {
                inputMap->addElement(cuIdx+rangeStart, status);
            }
            cpIdx++;
            if (cuIdx == inString.length()) {
               break;
            }
        }
    }
                
    // bestSnlp[i] is the snlp of the best segmentation of the first i
    // code points in the range to be matched.
    UVector32 bestSnlp(numCodePts + 1, status);
    bestSnlp.addElement(0, status);
    for(int32_t i = 1; i <= numCodePts; i++) {
        bestSnlp.addElement(kuint32max, status);
    }


    // prev[i] is the index of the last CJK code point in the previous word in 
    // the best segmentation of the first i characters.
    UVector32 prev(numCodePts + 1, status);
    for(int32_t i = 0; i <= numCodePts; i++){
        prev.addElement(-1, status);
    }

    const int32_t maxWordSize = 20;
    UVector32 values(numCodePts, status);
    values.setSize(numCodePts);
    UVector32 lengths(numCodePts, status);
    lengths.setSize(numCodePts);

    UText fu = UTEXT_INITIALIZER;
    utext_openUnicodeString(&fu, &inString, &status);

    // Dynamic programming to find the best segmentation.

    // In outer loop, i  is the code point index,
    //                ix is the corresponding string (code unit) index.
    //    They differ when the string contains supplementary characters.
    int32_t ix = 0;
    bool is_prev_katakana = false;
    for (int32_t i = 0;  i < numCodePts;  ++i, ix = inString.moveIndex32(ix, 1)) {
        if ((uint32_t)bestSnlp.elementAti(i) == kuint32max) {
            continue;
        }

        int32_t count;
        utext_setNativeIndex(&fu, ix);
        count = fDictionary->matches(&fu, maxWordSize, numCodePts,
                             NULL, lengths.getBuffer(), values.getBuffer(), NULL);
                             // Note: lengths is filled with code point lengths
                             //       The NULL parameter is the ignored code unit lengths.

        // if there are no single character matches found in the dictionary 
        // starting with this character, treat character as a 1-character word 
        // with the highest value possible, i.e. the least likely to occur.
        // Exclude Korean characters from this treatment, as they should be left
        // together by default.
        if ((count == 0 || lengths.elementAti(0) != 1) &&
                !fHangulWordSet.contains(inString.char32At(ix))) {
            values.setElementAt(maxSnlp, count);   // 255
            lengths.setElementAt(1, count++);
        }

        for (int32_t j = 0; j < count; j++) {
            uint32_t newSnlp = (uint32_t)bestSnlp.elementAti(i) + (uint32_t)values.elementAti(j);
            int32_t ln_j_i = lengths.elementAti(j) + i;
            if (newSnlp < (uint32_t)bestSnlp.elementAti(ln_j_i)) {
                bestSnlp.setElementAt(newSnlp, ln_j_i);
                prev.setElementAt(i, ln_j_i);
            }
        }

        // In Japanese,
        // Katakana word in single character is pretty rare. So we apply
        // the following heuristic to Katakana: any continuous run of Katakana
        // characters is considered a candidate word with a default cost
        // specified in the katakanaCost table according to its length.

        bool is_katakana = isKatakana(inString.char32At(ix));
        int32_t katakanaRunLength = 1;
        if (!is_prev_katakana && is_katakana) {
            int32_t j = inString.moveIndex32(ix, 1);
            // Find the end of the continuous run of Katakana characters
            while (j < inString.length() && katakanaRunLength < kMaxKatakanaGroupLength &&
                    isKatakana(inString.char32At(j))) {
                j = inString.moveIndex32(j, 1);
                katakanaRunLength++;
            }
            if (katakanaRunLength < kMaxKatakanaGroupLength) {
                uint32_t newSnlp = bestSnlp.elementAti(i) + getKatakanaCost(katakanaRunLength);
                if (newSnlp < (uint32_t)bestSnlp.elementAti(i+katakanaRunLength)) {
                    bestSnlp.setElementAt(newSnlp, i+katakanaRunLength);
                    prev.setElementAt(i, i+katakanaRunLength);  // prev[j] = i;
                }
            }
        }
        is_prev_katakana = is_katakana;
    }
    utext_close(&fu);

    // Start pushing the optimal offset index into t_boundary (t for tentative).
    // prev[numCodePts] is guaranteed to be meaningful.
    // We'll first push in the reverse order, i.e.,
    // t_boundary[0] = numCodePts, and afterwards do a swap.
    UVector32 t_boundary(numCodePts+1, status);

    int32_t numBreaks = 0;
    // No segmentation found, set boundary to end of range
    if ((uint32_t)bestSnlp.elementAti(numCodePts) == kuint32max) {
        t_boundary.addElement(numCodePts, status);
        numBreaks++;
    } else {
        for (int32_t i = numCodePts; i > 0; i = prev.elementAti(i)) {
            t_boundary.addElement(i, status);
            numBreaks++;
        }
        U_ASSERT(prev.elementAti(t_boundary.elementAti(numBreaks - 1)) == 0);
    }

    // Add a break for the start of the dictionary range if there is not one
    // there already.
    if (foundBreaks.size() == 0 || foundBreaks.peeki() < rangeStart) {
        t_boundary.addElement(0, status);
        numBreaks++;
    }

    // Now that we're done, convert positions in t_boundary[] (indices in 
    // the normalized input string) back to indices in the original input UText
    // while reversing t_boundary and pushing values to foundBreaks.
    int32_t prevCPPos = -1;
    int32_t prevUTextPos = -1;
    for (int32_t i = numBreaks-1; i >= 0; i--) {
        int32_t cpPos = t_boundary.elementAti(i);
        U_ASSERT(cpPos > prevCPPos);
        int32_t utextPos =  inputMap.isValid() ? inputMap->elementAti(cpPos) : cpPos + rangeStart;
        U_ASSERT(utextPos >= prevUTextPos);
        if (utextPos > prevUTextPos) {
            // Boundaries are added to foundBreaks output in ascending order.
            U_ASSERT(foundBreaks.size() == 0 || foundBreaks.peeki() < utextPos);
            foundBreaks.push(utextPos, status);
        } else {
            // Normalization expanded the input text, the dictionary found a boundary
            // within the expansion, giving two boundaries with the same index in the
            // original text. Ignore the second. See ticket #12918.
            --numBreaks;
        }
        prevCPPos = cpPos;
        prevUTextPos = utextPos;
    }
    (void)prevCPPos; // suppress compiler warnings about unused variable

    // inString goes out of scope
    // inputMap goes out of scope
    return numBreaks;
}